

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

void invert_L8(uchar *L,int n)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uchar *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  ulong local_58;
  ulong local_50;
  
  if (1 < n) {
    uVar2 = (ulong)((uint)n >> 3);
    uVar7 = (ulong)(uint)n;
    local_50 = (ulong)(((uint)n >> 3) * 2);
    local_58 = 2;
    uVar3 = 1;
    uVar11 = uVar2;
    do {
      uVar4 = uVar3 + 1;
      if (uVar4 < uVar7) {
        bVar12 = 0x80 >> ((byte)(uVar3 - 1) & 7);
        uVar9 = uVar3 - 1 >> 3 & 0x1fffffff;
        uVar5 = local_58;
        uVar10 = local_50;
        do {
          bVar1 = -((L[(ulong)((uint)((int)uVar5 * n) >> 3) + (uVar3 >> 3 & 0x1fffffff)] >>
                     (~(byte)uVar3 & 7) & 1) != 0);
          if (8 < uVar3) {
            lVar6 = 0;
            puVar8 = L;
            do {
              puVar8[uVar10] = puVar8[uVar10] ^ puVar8[uVar11] & bVar1;
              lVar6 = lVar6 + 8;
              puVar8 = puVar8 + 1;
            } while (lVar6 <= (long)(uVar3 - 9));
          }
          L[uVar5 * uVar2 + uVar9] =
               (bVar1 & L[uVar9 + uVar3 * uVar2] ^ L[uVar5 * uVar2 + uVar9]) & -bVar12 |
               L[uVar5 * uVar2 + uVar9] & bVar12 - 1;
          uVar5 = uVar5 + 1;
          uVar10 = uVar10 + uVar2;
        } while (uVar5 != uVar7);
      }
      local_58 = local_58 + 1;
      local_50 = local_50 + uVar2;
      uVar11 = uVar11 + uVar2;
      uVar3 = uVar4;
    } while (uVar4 != uVar7);
  }
  return;
}

Assistant:

void invert_L8(unsigned char *L, int n)
{
  /*
   * inversion == forward substitution
   *
   * For all columns c = 1 ... n-1
   *   For all rows c+1 ... n-1
   *     add (row c) * (leading (c'th) element of row r) to row r.
   *       only do it for the k elements k = 0 ... c-1
   */

  for(int c = 1; c <= n-1; c++)
  {
    /*
     * Basically:
     *      copy elements 0 to c-1  from c'th row to r'th row iff leading element of row r is 1
     */
    for(int r = c+1; r <= n-1; r++)
    {
      /*
       * first copy all "full bytes" at the left
       */
      unsigned char mask_rc = 0x00 - ((L[r*n/8 + (c/8)] >> (7 - (c % 8))) & 1); // mask for the element U(r,c)
      for(int k = 0; k <= c-1 - 8; k += 8)
      {
        L[r*(n/8) + k/8] ^= mask_rc & L[c*(n/8) + k/8];
      }

      /*
       * then handle the right-most "partial byte"
       */
      int k = c-1;
      unsigned char mask_prepending = ((unsigned char) (0x80 >> (k % 8)) - 1);

      unsigned char tmp_rk = L[r*(n/8) + k/8] & mask_prepending; // store the right side of the splitted byte in tmp
      L[r*(n/8) + k/8]  ^= (mask_rc & L[c*(n/8) + k/8]);

      // restore the right bits: first set bits 0, then 'or' tmp
      L[r*(n/8) + k/8] &= ~mask_prepending;
      L[r*(n/8) + k/8] |= tmp_rk;
    }
  }
}